

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_go_generator.cc
# Opt level: O1

void __thiscall
t_go_generator::generate_go_struct_equals
          (t_go_generator *this,ostream *out,t_struct *tstruct,string *tstruct_name)

{
  int *piVar1;
  long lVar2;
  t_type *type;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  t_type *ptVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  size_type *psVar9;
  _Alloc_hider _Var10;
  pointer pptVar11;
  string goType;
  string name;
  string srcv;
  string tgtv;
  string src;
  string tgt;
  string publicize_field_name;
  string field_name;
  string local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  undefined1 *local_1a0 [2];
  undefined1 local_190 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  long local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  t_struct *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string *local_f8;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_140 = tstruct;
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  local_1a0[0] = local_190;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1a0,lVar2,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar2);
  poVar5 = t_generator::indent(&this->super_t_generator,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"func (p *",9);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(tstruct_name->_M_dataplus)._M_p,tstruct_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->equals_method_name_)._M_dataplus._M_p,
                      (this->equals_method_name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(other *",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(tstruct_name->_M_dataplus)._M_p,tstruct_name->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,") bool {",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if p == other {",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return true",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"} else if p == nil || other == nil {",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return false",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  pptVar11 = (local_140->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar11 !=
      (local_140->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_f8 = &(this->super_t_generator).service_name_;
    do {
      std::__cxx11::string::_M_assign((string *)&local_50);
      type = (*pptVar11)->type_;
      publicize(&local_1e0,this,&local_50,false,local_f8);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_1e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      bVar3 = is_pointer_field(*pptVar11,false);
      type_to_go_type_with_opt_abi_cxx11_(&local_1e0,this,type,bVar3);
      std::operator+(&local_118,"p.",&local_70);
      std::operator+(&local_138,"other.",&local_70);
      ptVar6 = t_type::get_true_type(type);
      bVar3 = is_pointer_field(*pptVar11,false);
      if (bVar3) {
        iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[5])(ptVar6);
        if ((char)iVar4 == '\0') {
          iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[10])(ptVar6);
          if ((char)iVar4 == '\0') {
            iVar4 = (*(ptVar6->super_t_doc)._vptr_t_doc[0xd])(ptVar6);
            if ((char)iVar4 == '\0') goto LAB_001ff90b;
          }
        }
        std::operator+(&local_180,"(*",&local_118);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_180);
        local_160 = &local_150;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_150._M_allocated_capacity = *psVar9;
          local_150._8_8_ = plVar7[3];
        }
        else {
          local_150._M_allocated_capacity = *psVar9;
          local_160 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar7;
        }
        local_158 = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        std::operator+(&local_1c0,"(*",&local_138);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_1c0);
        local_180._M_dataplus._M_p = (pointer)&local_180.field_2;
        psVar9 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar9) {
          local_180.field_2._M_allocated_capacity = *psVar9;
          local_180.field_2._8_8_ = plVar7[3];
        }
        else {
          local_180.field_2._M_allocated_capacity = *psVar9;
          local_180._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_180._M_string_length = plVar7[1];
        *plVar7 = (long)psVar9;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if ",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," != ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," {",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if ",3);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_118._M_dataplus._M_p,local_118._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," == nil || ",0xb);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_138._M_dataplus._M_p,local_138._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," == nil {",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + 1;
        t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return false",0xc);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_d0,local_160,local_160->_M_local_buf + local_158);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_180._M_dataplus._M_p,
                   local_180._M_dataplus._M_p + local_180._M_string_length);
        generate_go_equals(this,out,type,&local_d0,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p);
        }
        piVar1 = &(this->super_t_generator).indent_;
        *piVar1 = *piVar1 + -1;
        t_generator::indent_abi_cxx11_(&local_1c0,&this->super_t_generator);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
          operator_delete(local_1c0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_180._M_dataplus._M_p != &local_180.field_2) {
          operator_delete(local_180._M_dataplus._M_p);
        }
        paVar8 = &local_150;
        _Var10._M_p = (pointer)local_160;
      }
      else {
LAB_001ff90b:
        local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f0,local_118._M_dataplus._M_p,
                   local_118._M_dataplus._M_p + local_118._M_string_length);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_b0,local_138._M_dataplus._M_p,
                   local_138._M_dataplus._M_p + local_138._M_string_length);
        generate_go_equals(this,out,type,&local_f0,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        paVar8 = &local_f0.field_2;
        _Var10._M_p = local_f0._M_dataplus._M_p;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var10._M_p != paVar8) {
        operator_delete(_Var10._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             (local_140->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return true",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1e0,&this->super_t_generator);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_1a0[0] != local_190) {
    operator_delete(local_1a0[0]);
  }
  return;
}

Assistant:

void t_go_generator::generate_go_struct_equals(ostream& out,
                                               t_struct* tstruct,
                                               const string& tstruct_name) {
  string name(tstruct->get_name());
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;
  indent(out) << "func (p *" << tstruct_name << ") " << equals_method_name_ << "(other *"
              << tstruct_name << ") bool {" << endl;
  indent_up();

  string field_name;
  string publicize_field_name;
  out << indent() << "if p == other {" << endl;
  indent_up();
  out << indent() << "return true" << endl;
  indent_down();
  out << indent() << "} else if p == nil || other == nil {" << endl;
  indent_up();
  out << indent() << "return false" << endl;
  indent_down();
  out << indent() << "}" << endl;

  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    field_name = (*f_iter)->get_name();
    t_type* field_type = (*f_iter)->get_type();
    publicize_field_name = publicize(field_name);
    string goType = type_to_go_type_with_opt(field_type, is_pointer_field(*f_iter));

    string tgt = "p." + publicize_field_name;
    string src = "other." + publicize_field_name;
    t_type* ttype = field_type->get_true_type();
    // Compare field contents
    if (is_pointer_field(*f_iter)
        && (ttype->is_base_type() || ttype->is_enum() || ttype->is_container())) {
      string tgtv = "(*" + tgt + ")";
      string srcv = "(*" + src + ")";
      out << indent() << "if " << tgt << " != " << src << " {" << endl;
      indent_up();
      out << indent() << "if " << tgt << " == nil || " << src << " == nil {" << endl;
      indent_up();
      out << indent() << "return false" << endl;
      indent_down();
      out << indent() << "}" << endl;
      generate_go_equals(out, field_type, tgtv, srcv);
      indent_down();
      out << indent() << "}" << endl;
    } else {
      generate_go_equals(out, field_type, tgt, src);
    }
  }
  out << indent() << "return true" << endl;
  indent_down();
  out << indent() << "}" << endl << endl;
}